

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.c
# Opt level: O1

_Bool duckdb_je_rtree_new(rtree_t *rtree,base_t *base,_Bool zeroed)

{
  _Bool _Var1;
  
  rtree->base = base;
  _Var1 = duckdb_je_malloc_mutex_init
                    (&rtree->init_lock,"rtree",WITNESS_RANK_RTREE,malloc_mutex_rank_exclusive);
  return _Var1;
}

Assistant:

bool
rtree_new(rtree_t *rtree, base_t *base, bool zeroed) {
#ifdef JEMALLOC_JET
	if (!zeroed) {
		memset(rtree, 0, sizeof(rtree_t)); /* Clear root. */
	}
#else
	assert(zeroed);
#endif
	rtree->base = base;

	if (malloc_mutex_init(&rtree->init_lock, "rtree", WITNESS_RANK_RTREE,
	    malloc_mutex_rank_exclusive)) {
		return true;
	}

	return false;
}